

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O3

void __thiscall gimage::PNGImageIO::save(PNGImageIO *this,ImageU8 *image,char *name)

{
  size_type *psVar1;
  png_charp *ppcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  FILE *__stream;
  __jmp_buf_tag *__env;
  undefined8 *puVar5;
  char *pcVar6;
  ulong uVar7;
  void *pvVar8;
  long lVar9;
  long *plVar10;
  IOException *pIVar11;
  long *plVar12;
  void *pvVar13;
  long lVar14;
  long lVar15;
  png_charp pcVar16;
  ulong uVar17;
  undefined8 uVar18;
  long lVar19;
  png_structp png;
  png_infop info;
  string tm;
  string vs;
  png_text text [2];
  time_t tt;
  
  iVar4 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,0);
  if (((char)iVar4 == '\0') || ((image->depth | 2U) != 3)) {
    pIVar11 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&tm,name,(allocator *)&png);
    std::operator+(&vs,"Can only save PNG images with depth 1 or 3 (",&tm);
    plVar12 = (long *)std::__cxx11::string::append((char *)&vs);
    text[0]._0_8_ = *plVar12;
    plVar10 = plVar12 + 2;
    if ((long *)text[0]._0_8_ == plVar10) {
      text[0].text = (png_charp)*plVar10;
      text[0].text_length = plVar12[3];
      text[0]._0_8_ = &text[0].text;
    }
    else {
      text[0].text = (png_charp)*plVar10;
    }
    text[0].key = (png_charp)plVar12[1];
    *plVar12 = (long)plVar10;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    gutil::IOException::IOException(pIVar11,(string *)text);
    __cxa_throw(pIVar11,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __stream = fopen(name,"wb");
  if (__stream == (FILE *)0x0) {
    pIVar11 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&tm,name,(allocator *)&png);
    std::operator+(&vs,"Cannot open file (",&tm);
    plVar12 = (long *)std::__cxx11::string::append((char *)&vs);
    text[0]._0_8_ = *plVar12;
    plVar10 = plVar12 + 2;
    if ((long *)text[0]._0_8_ == plVar10) {
      text[0].text = (png_charp)*plVar10;
      text[0].text_length = plVar12[3];
      text[0]._0_8_ = &text[0].text;
    }
    else {
      text[0].text = (png_charp)*plVar10;
    }
    text[0].key = (png_charp)plVar12[1];
    *plVar12 = (long)plVar10;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    gutil::IOException::IOException(pIVar11,(string *)text);
    __cxa_throw(pIVar11,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  png = (png_structp)png_create_write_struct("1.6.37",0,0);
  if (png == (png_structp)0x0) {
    fclose(__stream);
    pIVar11 = (IOException *)__cxa_allocate_exception(0x28);
    text[0]._0_8_ = &text[0].text;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)text,"Cannot allocate handle for writing PNG files","");
    gutil::IOException::IOException(pIVar11,(string *)text);
    __cxa_throw(pIVar11,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  info = (png_infop)png_create_info_struct(png);
  if (info == (png_infop)0x0) {
    png_destroy_write_struct(&png,0);
    fclose(__stream);
    pIVar11 = (IOException *)__cxa_allocate_exception(0x28);
    text[0]._0_8_ = &text[0].text;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)text,"Cannot allocate PNG info structure","");
    gutil::IOException::IOException(pIVar11,(string *)text);
    __cxa_throw(pIVar11,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(png,longjmp,200);
  iVar4 = _setjmp(__env);
  if (iVar4 != 0) {
    png_destroy_write_struct(&png,&info);
    fclose(__stream);
    pIVar11 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&tm,name,(allocator *)&tt);
    std::operator+(&vs,"Cannot read PNG file (",&tm);
    plVar12 = (long *)std::__cxx11::string::append((char *)&vs);
    text[0]._0_8_ = *plVar12;
    plVar10 = plVar12 + 2;
    if ((long *)text[0]._0_8_ == plVar10) {
      text[0].text = (png_charp)*plVar10;
      text[0].text_length = plVar12[3];
      text[0]._0_8_ = &text[0].text;
    }
    else {
      text[0].text = (png_charp)*plVar10;
    }
    text[0].key = (png_charp)plVar12[1];
    *plVar12 = (long)plVar10;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    gutil::IOException::IOException(pIVar11,(string *)text);
    __cxa_throw(pIVar11,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  png_init_io(png,__stream);
  png_set_IHDR(png,info,(int)image->width,(int)image->height,8,(image->depth == 3) * '\x02',0,0,0);
  ppcVar2 = &text[0].text;
  text[0]._0_8_ = ppcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)text,"cvkit version ","");
  paVar3 = &tm.field_2;
  tm._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&tm,"2.6.17","");
  pcVar16 = (png_charp)0xf;
  if ((png_charp *)text[0]._0_8_ != ppcVar2) {
    pcVar16 = text[0].text;
  }
  if (pcVar16 < text[0].key + tm._M_string_length) {
    uVar18 = (png_charp)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tm._M_dataplus._M_p != paVar3) {
      uVar18 = tm.field_2._M_allocated_capacity;
    }
    if (text[0].key + tm._M_string_length <= (ulong)uVar18) {
      puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)&tm,0,(char *)0x0,text[0]._0_8_);
      goto LAB_0014901f;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)text,(ulong)tm._M_dataplus._M_p);
LAB_0014901f:
  vs._M_dataplus._M_p = (pointer)&vs.field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    vs.field_2._M_allocated_capacity = *psVar1;
    vs.field_2._8_8_ = puVar5[3];
  }
  else {
    vs.field_2._M_allocated_capacity = *psVar1;
    vs._M_dataplus._M_p = (pointer)*puVar5;
  }
  vs._M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(char *)psVar1 = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tm._M_dataplus._M_p != paVar3) {
    operator_delete(tm._M_dataplus._M_p);
  }
  if ((png_charp *)text[0]._0_8_ != ppcVar2) {
    operator_delete((void *)text[0]._0_8_);
  }
  tt = time((time_t *)0x0);
  pcVar6 = ctime(&tt);
  std::__cxx11::string::string((string *)&tm,pcVar6,(allocator *)text);
  text[0].text_length = 0;
  text[1].lang = (png_charp)0x0;
  text[1].lang_key = (png_charp)0x0;
  text[1].text_length = 0;
  text[1].itxt_length = 0;
  text[1].key = (png_charp)0x0;
  text[1].text = (png_charp)0x0;
  text[0].lang_key = (png_charp)0x0;
  text[1].compression = 0;
  text[1]._4_4_ = 0;
  text[0].itxt_length = 0;
  text[0].lang = (png_charp)0x0;
  text[0].compression = -1;
  text[0]._4_4_ = 0;
  text[0].key = "Software";
  text[0].text = vs._M_dataplus._M_p;
  text[0].text_length = strlen(vs._M_dataplus._M_p);
  text[1].compression = -1;
  text[1].key = "Creation Time";
  text[1].text = tm._M_dataplus._M_p;
  text[1].text_length = strlen(tm._M_dataplus._M_p);
  png_set_text(png,info,text,2);
  png_write_info(png,info);
  uVar7 = (long)image->depth * image->width;
  uVar17 = 0xffffffffffffffff;
  if (-1 < (long)uVar7) {
    uVar17 = uVar7;
  }
  pvVar8 = operator_new__(uVar17);
  if (0 < image->height) {
    lVar9 = 0;
    do {
      lVar15 = image->width;
      if (0 < lVar15) {
        uVar17 = (ulong)(uint)image->depth;
        lVar19 = 0;
        pvVar13 = pvVar8;
        do {
          if (0 < (int)uVar17) {
            lVar14 = 0;
            do {
              *(uchar *)((long)pvVar13 + lVar14) = image->img[lVar14][lVar9][lVar19];
              lVar14 = lVar14 + 1;
              uVar17 = (ulong)image->depth;
            } while (lVar14 < (long)uVar17);
            lVar15 = image->width;
            pvVar13 = (void *)((long)pvVar13 + lVar14);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < lVar15);
      }
      png_write_row(png,pvVar8);
      lVar9 = lVar9 + 1;
    } while (lVar9 < image->height);
  }
  png_write_end(png,info);
  operator_delete__(pvVar8);
  fclose(__stream);
  png_destroy_write_struct(&png,&info);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tm._M_dataplus._M_p != paVar3) {
    operator_delete(tm._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vs._M_dataplus._M_p != &vs.field_2) {
    operator_delete(vs._M_dataplus._M_p);
  }
  return;
}

Assistant:

void PNGImageIO::save(const ImageU8 &image, const char *name) const
{
  if (!handlesFile(name, false) || (image.getDepth() != 1 && image.getDepth() != 3))
  {
    throw gutil::IOException("Can only save PNG images with depth 1 or 3 ("+std::string(name)+")");
  }

  // initialize writing a png file

  FILE *out=fopen(name, "wb");

  if (out == 0)
  {
    throw gutil::IOException("Cannot open file ("+std::string(name)+")");
  }

  png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    fclose(out);
    throw gutil::IOException("Cannot allocate handle for writing PNG files");
  }

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_write_struct(&png, static_cast<png_infopp>(0));
    fclose(out);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  unsigned char *row=0;

  if (setjmp(png_jmpbuf(png)))
  {
    delete [] row;

    png_destroy_write_struct(&png, &info);
    fclose(out);
    throw gutil::IOException("Cannot read PNG file ("+std::string(name)+")");
  }

  // write header

  png_init_io(png, out);

  int color=PNG_COLOR_TYPE_GRAY;

  if (image.getDepth() == 3)
  {
    color=PNG_COLOR_TYPE_RGB;
  }

  png_set_IHDR(png, info, image.getWidth(), image.getHeight(), 8, color,
               PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
               PNG_FILTER_TYPE_DEFAULT);

  std::string vs=std::string("cvkit version ")+std::string(VERSION);

  time_t tt=time(0);
  std::string tm=ctime(&tt);

  png_text text[2];
  memset(text, 0, 2*sizeof(png_text));

  text[0].compression=PNG_TEXT_COMPRESSION_NONE;
  text[0].key=const_cast<char *>("Software");
  text[0].text=const_cast<char *>(vs.c_str());
  text[0].text_length=strlen(text[0].text);

  text[1].compression=PNG_TEXT_COMPRESSION_NONE;
  text[1].key=const_cast<char *>("Creation Time");
  text[1].text=const_cast<char *>(tm.c_str());
  text[1].text_length=strlen(text[1].text);

  png_set_text(png, info, text, 2);

  png_write_info(png, info);

  // write image

  row=new unsigned char [image.getDepth()*image.getWidth()];

  // write image content line by line

  for (long k=0; k<image.getHeight(); k++)
  {
    unsigned char *rp=row;

    for (long i=0; i<image.getWidth(); i++)
    {
      for (int j=0; j<image.getDepth(); j++)
      {
        *rp++=image.get(i, k, j);
      }
    }

    png_write_row(png, row);
  }

  // finish writing and close file

  png_write_end(png, info);

  delete [] row;

  fclose(out);

  png_destroy_write_struct(&png, &info);
}